

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

bool32 __thiscall rw::Image::hasAlpha(Image *this)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint8 *line;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  pbVar1 = this->pixels;
  iVar3 = this->depth;
  iVar5 = 0;
  if (iVar3 == 0x20) {
    iVar3 = this->width;
    if (this->width < 1) {
      iVar3 = 0;
    }
    iVar6 = this->height;
    if (this->height < 1) {
      iVar6 = 0;
    }
    pbVar1 = pbVar1 + 3;
    bVar2 = 0xff;
    for (; pbVar4 = pbVar1, iVar7 = iVar3, iVar5 != iVar6; iVar5 = iVar5 + 1) {
      while (iVar7 != 0) {
        bVar2 = bVar2 & *pbVar4;
        pbVar4 = pbVar4 + this->bpp;
        iVar7 = iVar7 + -1;
      }
      pbVar1 = pbVar1 + this->stride;
    }
  }
  else {
    if (iVar3 == 0x18) {
      return 0;
    }
    if (iVar3 == 0x10) {
      iVar5 = 0;
      iVar3 = this->width;
      if (this->width < 1) {
        iVar3 = 0;
      }
      iVar6 = this->height;
      if (this->height < 1) {
        iVar6 = 0;
      }
      for (; iVar7 = iVar3, iVar5 != iVar6; iVar5 = iVar5 + 1) {
        do {
          bVar8 = iVar7 != 0;
          iVar7 = iVar7 + -1;
        } while (bVar8);
      }
      return 1;
    }
    bVar2 = 0xff;
    if (iVar3 < 9) {
      iVar5 = 0;
      iVar3 = this->width;
      if (this->width < 1) {
        iVar3 = 0;
      }
      iVar6 = this->height;
      if (this->height < 1) {
        iVar6 = iVar5;
      }
      for (; pbVar4 = pbVar1, iVar7 = iVar3, iVar5 != iVar6; iVar5 = iVar5 + 1) {
        while (iVar7 != 0) {
          bVar2 = bVar2 & this->palette[(ulong)*pbVar4 * 4 + 3];
          pbVar4 = pbVar4 + this->bpp;
          iVar7 = iVar7 + -1;
        }
        pbVar1 = pbVar1 + this->stride;
      }
    }
  }
  return (uint)(bVar2 != 0xff);
}

Assistant:

bool32
Image::hasAlpha(void)
{
	uint8 ret = 0xFF;
	uint8 *pixels = this->pixels;
	if(this->depth == 32){
		for(int y = 0; y < this->height; y++){
			uint8 *line = pixels;
			for(int x = 0; x < this->width; x++){
				ret &= line[3];
				line += this->bpp;
			}
			pixels += this->stride;
		}
	}else if(this->depth == 24){
		return 0;
	}else if(this->depth == 16){
		for(int y = 0; y < this->height; y++){
			uint8 *line = pixels;
			for(int x = 0; x < this->width; x++){
				ret &= line[1] & 0x80;
				line += this->bpp;
			}
			pixels += this->stride;
		}
		return ret != 0x80;
	}else if(this->depth <= 8){
		for(int y = 0; y < this->height; y++){
			uint8 *line = pixels;
			for(int x = 0; x < this->width; x++){
				ret &= this->palette[*line*4+3];
				line += this->bpp;
			}
			pixels += this->stride;
		}
	}
	return ret != 0xFF;
}